

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XSDDOMParser::startAnnotation
          (XSDDOMParser *this,XMLElementDecl *elemDecl,RefVectorOf<xercesc_4_0::XMLAttr> *attrList,
          XMLSize_t attrCount)

{
  XMLBuffer *this_00;
  XMLScanner *this_01;
  bool bVar1;
  int iVar2;
  XMLCh *pXVar3;
  XMLAttr *this_02;
  XMLCh *pXVar4;
  ValueVectorOf<xercesc_4_0::PrefMapElem_*> *this_03;
  PrefMapElem **ppPVar5;
  undefined1 *str1;
  uint *toAdd;
  ValueVectorOf<unsigned_int> *this_04;
  XMLSize_t j;
  ulong getAt;
  XMLSize_t i;
  XMLSize_t getAt_00;
  uint prefId;
  uint local_48;
  uint local_44;
  BaseRefVectorOf<xercesc_4_0::XMLAttr> *local_40;
  XMLSize_t local_38;
  
  this_00 = &this->fAnnotationBuf;
  local_40 = &attrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>;
  local_38 = attrCount;
  XMLBuffer::append(this_00,L'<');
  pXVar3 = XMLElementDecl::getFullName(elemDecl);
  XMLBuffer::append(this_00,pXVar3);
  XMLBuffer::append(this_00,L' ');
  this->fURIs->fCurCount = 0;
  getAt_00 = 0;
  do {
    if (local_38 == getAt_00) {
      this_03 = ElemStack::getNamespaceMap
                          (&((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->
                            fElemStack);
      for (getAt = 0; getAt < this_03->fCurCount; getAt = getAt + 1) {
        ppPVar5 = ValueVectorOf<xercesc_4_0::PrefMapElem_*>::elementAt(this_03,getAt);
        prefId = (*ppPVar5)->fPrefId;
        bVar1 = ValueVectorOf<unsigned_int>::containsElement(this->fURIs,&prefId,0);
        if (!bVar1) {
          str1 = (undefined1 *)
                 XMLStringPool::getValueForId
                           (&(((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->
                             fElemStack).fPrefixPool,prefId);
          bVar1 = XMLString::equals((XMLCh *)str1,L"");
          if (bVar1) {
            str1 = XMLUni::fgXMLNSString;
          }
          else {
            XMLBuffer::append(this_00,(XMLCh *)XMLUni::fgXMLNSColonString);
          }
          XMLBuffer::append(this_00,(XMLCh *)str1);
          XMLBuffer::append(this_00,L'=');
          XMLBuffer::append(this_00,L'\"');
          this_01 = (this->super_XercesDOMParser).super_AbstractDOMParser.fScanner;
          ppPVar5 = ValueVectorOf<xercesc_4_0::PrefMapElem_*>::elementAt(this_03,getAt);
          pXVar3 = XMLScanner::getURIText(this_01,(*ppPVar5)->fURIId);
          XMLBuffer::append(this_00,pXVar3);
          XMLBuffer::append(this_00,L'\"');
          XMLBuffer::append(this_00,L' ');
          ValueVectorOf<unsigned_int>::addElement(this->fURIs,&prefId);
        }
      }
      XMLBuffer::append(this_00,L'>');
      XMLBuffer::append(this_00,L'\n');
      return;
    }
    this_02 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt(local_40,getAt_00);
    pXVar3 = this_02->fValue;
    bVar1 = XMLString::equals(this_02->fAttName->fLocalPart,(XMLCh *)XMLUni::fgXMLNSString);
    if (bVar1) {
      this_04 = this->fURIs;
      local_44 = XMLStringPool::getId
                           (&(((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->
                             fElemStack).fPrefixPool,L"");
      toAdd = &local_44;
LAB_003239e7:
      ValueVectorOf<unsigned_int>::addElement(this_04,toAdd);
    }
    else {
      pXVar4 = XMLAttr::getQName(this_02);
      iVar2 = XMLString::compareNString(pXVar4,(XMLCh *)XMLUni::fgXMLNSColonString,6);
      if (iVar2 == 0) {
        this_04 = this->fURIs;
        local_48 = XMLStringPool::getId
                             (&(((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->
                               fElemStack).fPrefixPool,this_02->fAttName->fLocalPart);
        toAdd = &local_48;
        goto LAB_003239e7;
      }
    }
    pXVar4 = XMLAttr::getQName(this_02);
    XMLBuffer::append(this_00,pXVar4);
    XMLBuffer::append(this_00,L'=');
    XMLBuffer::append(this_00,L'\"');
    XMLBuffer::append(this_00,pXVar3);
    XMLBuffer::append(this_00,L'\"');
    XMLBuffer::append(this_00,L' ');
    getAt_00 = getAt_00 + 1;
  } while( true );
}

Assistant:

void XSDDOMParser::startAnnotation( const XMLElementDecl&       elemDecl
                                  , const RefVectorOf<XMLAttr>& attrList
                                  , const XMLSize_t             attrCount)
{
    fAnnotationBuf.append(chOpenAngle);
	fAnnotationBuf.append(elemDecl.getFullName());
    fAnnotationBuf.append(chSpace);

    // attributes are a bit of a pain.  To get this right, we have to keep track
    // of the namespaces we've seen declared, then examine the namespace context
    // for other namespaces so that we can also include them.
    // optimized for simplicity and the case that not many
    // namespaces are declared on this annotation...
    fURIs->removeAllElements();
    for (XMLSize_t i=0; i < attrCount; i++) {

        const XMLAttr* oneAttrib = attrList.elementAt(i);
        const XMLCh* attrValue = oneAttrib->getValue();

        if (XMLString::equals(oneAttrib->getName(), XMLUni::fgXMLNSString))
            fURIs->addElement(fScanner->getPrefixId(XMLUni::fgZeroLenString));
        else  if (!XMLString::compareNString(oneAttrib->getQName(), XMLUni::fgXMLNSColonString, 6))
            fURIs->addElement(fScanner->getPrefixId(oneAttrib->getName()));

        fAnnotationBuf.append(oneAttrib->getQName());
        fAnnotationBuf.append(chEqual);
        fAnnotationBuf.append(chDoubleQuote);
        fAnnotationBuf.append(attrValue);
        fAnnotationBuf.append(chDoubleQuote);
        fAnnotationBuf.append(chSpace);
    }

    // now we have to look through currently in-scope namespaces to see what
    // wasn't declared here
    ValueVectorOf<PrefMapElem*>* namespaceContext = fScanner->getNamespaceContext();
    for (XMLSize_t j=0; j < namespaceContext->size(); j++)
    {
        unsigned int prefId = namespaceContext->elementAt(j)->fPrefId;

        if (!fURIs->containsElement(prefId)) {

            const XMLCh* prefix = fScanner->getPrefixForId(prefId);

            if (XMLString::equals(prefix, XMLUni::fgZeroLenString)) {
                fAnnotationBuf.append(XMLUni::fgXMLNSString);
            }
            else  {
                fAnnotationBuf.append(XMLUni::fgXMLNSColonString);
                fAnnotationBuf.append(prefix);
            }

            fAnnotationBuf.append(chEqual);
            fAnnotationBuf.append(chDoubleQuote);
            fAnnotationBuf.append(fScanner->getURIText(namespaceContext->elementAt(j)->fURIId));
            fAnnotationBuf.append(chDoubleQuote);
            fAnnotationBuf.append(chSpace);

            fURIs->addElement(prefId);
        }
    }

    fAnnotationBuf.append(chCloseAngle);
    fAnnotationBuf.append(chLF);
}